

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void ZopfliLengthsToSymbols(uint *lengths,size_t n,uint maxbits,uint *symbols)

{
  size_t __size;
  long lVar1;
  uint uVar2;
  undefined8 *__ptr;
  void *__ptr_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  __size = (ulong)(maxbits + 1) * 8;
  __ptr = (undefined8 *)malloc(__size);
  __ptr_00 = malloc(__size);
  for (uVar2 = 0; uVar2 < n; uVar2 = uVar2 + 1) {
    symbols[uVar2] = 0;
  }
  for (uVar3 = 0; maxbits + 1 != uVar3; uVar3 = uVar3 + 1) {
    __ptr[uVar3] = 0;
  }
  for (lVar4 = 0; (uint)lVar4 < (uint)n; lVar4 = lVar4 + 1) {
    __ptr[lengths[lVar4]] = __ptr[lengths[lVar4]] + 1;
  }
  *__ptr = 0;
  uVar5 = 0;
  for (uVar3 = 1; uVar3 <= maxbits; uVar3 = uVar3 + 1) {
    uVar5 = ((uVar5 & 0xffffffff) + __ptr[uVar3 - 1]) * 2;
    *(ulong *)((long)__ptr_00 + uVar3 * 8) = uVar5 & 0xffffffff;
  }
  for (lVar4 = 0; (uint)lVar4 < (uint)n; lVar4 = lVar4 + 1) {
    uVar3 = (ulong)lengths[lVar4];
    if (uVar3 != 0) {
      lVar1 = *(long *)((long)__ptr_00 + uVar3 * 8);
      symbols[lVar4] = (uint)lVar1;
      *(long *)((long)__ptr_00 + uVar3 * 8) = lVar1 + 1;
    }
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void ZopfliLengthsToSymbols(const unsigned* lengths, size_t n, unsigned maxbits,
                            unsigned* symbols) {
  size_t* bl_count = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  size_t* next_code = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  unsigned bits, i;
  unsigned code;

  for (i = 0; i < n; i++) {
    symbols[i] = 0;
  }

  /* 1) Count the number of codes for each code length. Let bl_count[N] be the
  number of codes of length N, N >= 1. */
  for (bits = 0; bits <= maxbits; bits++) {
    bl_count[bits] = 0;
  }
  for (i = 0; i < n; i++) {
    assert(lengths[i] <= maxbits);
    bl_count[lengths[i]]++;
  }
  /* 2) Find the numerical value of the smallest code for each code length. */
  code = 0;
  bl_count[0] = 0;
  for (bits = 1; bits <= maxbits; bits++) {
    code = (code + bl_count[bits-1]) << 1;
    next_code[bits] = code;
  }
  /* 3) Assign numerical values to all codes, using consecutive values for all
  codes of the same length with the base values determined at step 2. */
  for (i = 0;  i < n; i++) {
    unsigned len = lengths[i];
    if (len != 0) {
      symbols[i] = next_code[len];
      next_code[len]++;
    }
  }

  free(bl_count);
  free(next_code);
}